

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::DecimalUnaryOpBind<duckdb::AbsOperator>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType PVar1;
  pointer pEVar2;
  reference other;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType decimal_type;
  nullptr_t in_stack_fffffffffffffea8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffeb0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *__x;
  undefined7 in_stack_fffffffffffffed0;
  LogicalType local_128 [56];
  LogicalType local_f0 [56];
  LogicalType local_b8 [32];
  LogicalType *in_stack_ffffffffffffff68;
  LogicalType local_70 [56];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_38;
  
  this._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffeb0);
  __x = &local_38;
  duckdb::LogicalType::LogicalType((LogicalType *)__x,(LogicalType *)(pEVar2 + 0x38));
  PVar1 = LogicalType::InternalType((LogicalType *)__x);
  if (PVar1 == INT16) {
    duckdb::LogicalType::LogicalType(local_70,SMALLINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(in_stack_ffffffffffffff68);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              CONCAT17(PVar1,in_stack_fffffffffffffed0),__x);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0xdd732f);
    duckdb::LogicalType::~LogicalType(local_70);
  }
  else if (PVar1 == INT32) {
    duckdb::LogicalType::LogicalType(local_b8,INTEGER);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(in_stack_ffffffffffffff68);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              CONCAT17(PVar1,in_stack_fffffffffffffed0),__x);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0xdd73d4);
    duckdb::LogicalType::~LogicalType(local_b8);
  }
  else if (PVar1 == INT64) {
    duckdb::LogicalType::LogicalType(local_f0,BIGINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(in_stack_ffffffffffffff68);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              CONCAT17(PVar1,in_stack_fffffffffffffed0),__x);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0xdd745a);
    duckdb::LogicalType::~LogicalType(local_f0);
  }
  else {
    duckdb::LogicalType::LogicalType(local_128,HUGEINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>(in_stack_ffffffffffffff68);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              CONCAT17(PVar1,in_stack_fffffffffffffed0),__x);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0xdd74d1);
    duckdb::LogicalType::~LogicalType(local_128);
  }
  other = vector<duckdb::LogicalType,_true>::operator[]
                    (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  LogicalType::operator=((LogicalType *)this._M_head_impl,other);
  LogicalType::operator=((LogicalType *)this._M_head_impl,other);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             other,in_stack_fffffffffffffea8);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_38);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> DecimalUnaryOpBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	switch (decimal_type.InternalType()) {
	case PhysicalType::INT16:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::SMALLINT);
		break;
	case PhysicalType::INT32:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::INTEGER);
		break;
	case PhysicalType::INT64:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::BIGINT);
		break;
	default:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::HUGEINT);
		break;
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = decimal_type;
	return nullptr;
}